

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_buffer.cpp
# Opt level: O1

void addTests_Image_Buffer(UnitTestFramework *framework)

{
  ulong *puVar1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined8 *puVar4;
  ulong uVar5;
  ulong *local_150;
  long local_148;
  ulong local_140;
  undefined8 uStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  undefined8 uStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100;
  undefined8 uStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  string local_90;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  paVar3 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"template_image::EmptyConstructor","");
  UnitTestFramework::add(framework,template_image::EmptyConstructor,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"template_image::Constructor","");
  UnitTestFramework::add(framework,template_image::Constructor,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"template_image::NullAssignment","");
  UnitTestFramework::add(framework,template_image::NullAssignment,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"CopyConstructor","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_a8 + local_68)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_68)) goto LAB_00139097;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_00139097:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
  }
  local_150 = &local_140;
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_c8 + local_148)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_148)) goto LAB_00139182;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_00139182:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_d0);
  }
  local_130 = &local_120;
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"uint8_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_e8 + local_128)) {
    uVar5 = 0xf;
    if (local_f0 != local_e0) {
      uVar5 = local_e0[0];
    }
    if (uVar5 < (ulong)(local_e8 + local_128)) goto LAB_00139256;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_00139256:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0);
  }
  local_110 = &local_100;
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013932e;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013932e:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90.field_2._8_8_ = puVar4[3];
    local_90._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_90._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_CopyConstructor<unsigned_char>,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"CopyConstructor","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_a8 + local_68)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_68)) goto LAB_0013951a;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013951a:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_c8 + local_148)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_148)) goto LAB_001395fd;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_001395fd:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"uint16_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_e8 + local_128)) {
    uVar5 = 0xf;
    if (local_f0 != local_e0) {
      uVar5 = local_e0[0];
    }
    if (uVar5 < (ulong)(local_e8 + local_128)) goto LAB_001396ca;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_001396ca:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_00139794;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_00139794:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90.field_2._8_8_ = puVar4[3];
    local_90._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_90._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_CopyConstructor<unsigned_short>,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"CopyConstructor","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_a8 + local_68)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_68)) goto LAB_00139980;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_00139980:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_c8 + local_148)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_148)) goto LAB_00139a63;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_00139a63:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"uint32_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_e8 + local_128)) {
    uVar5 = 0xf;
    if (local_f0 != local_e0) {
      uVar5 = local_e0[0];
    }
    if (uVar5 < (ulong)(local_e8 + local_128)) goto LAB_00139b30;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_00139b30:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_00139bfa;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_00139bfa:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90.field_2._8_8_ = puVar4[3];
    local_90._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_90._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_CopyConstructor<unsigned_int>,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"CopyConstructor","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_a8 + local_68)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_68)) goto LAB_00139de6;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_00139de6:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_c8 + local_148)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_148)) goto LAB_00139ec9;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_00139ec9:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"uint64_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_e8 + local_128)) {
    uVar5 = 0xf;
    if (local_f0 != local_e0) {
      uVar5 = local_e0[0];
    }
    if (uVar5 < (ulong)(local_e8 + local_128)) goto LAB_00139f96;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_00139f96:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013a060;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013a060:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90.field_2._8_8_ = puVar4[3];
    local_90._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_90._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_CopyConstructor<unsigned_long>,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"CopyConstructor","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_a8 + local_68)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_68)) goto LAB_0013a24c;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013a24c:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_c8 + local_148)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_148)) goto LAB_0013a32f;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013a32f:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"int8_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_e8 + local_128)) {
    uVar5 = 0xf;
    if (local_f0 != local_e0) {
      uVar5 = local_e0[0];
    }
    if (uVar5 < (ulong)(local_e8 + local_128)) goto LAB_0013a3fc;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013a3fc:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013a4c6;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013a4c6:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90.field_2._8_8_ = puVar4[3];
    local_90._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_90._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_CopyConstructor<signed_char>,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"CopyConstructor","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_a8 + local_68)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_68)) goto LAB_0013a6b2;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013a6b2:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_c8 + local_148)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_148)) goto LAB_0013a795;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013a795:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"int16_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_e8 + local_128)) {
    uVar5 = 0xf;
    if (local_f0 != local_e0) {
      uVar5 = local_e0[0];
    }
    if (uVar5 < (ulong)(local_e8 + local_128)) goto LAB_0013a862;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013a862:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013a92c;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013a92c:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90.field_2._8_8_ = puVar4[3];
    local_90._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_90._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_CopyConstructor<short>,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"CopyConstructor","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_a8 + local_68)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_68)) goto LAB_0013ab18;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013ab18:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_c8 + local_148)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_148)) goto LAB_0013abfb;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013abfb:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"int32_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_e8 + local_128)) {
    uVar5 = 0xf;
    if (local_f0 != local_e0) {
      uVar5 = local_e0[0];
    }
    if (uVar5 < (ulong)(local_e8 + local_128)) goto LAB_0013acc8;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013acc8:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013ad92;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013ad92:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90.field_2._8_8_ = puVar4[3];
    local_90._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_90._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_CopyConstructor<int>,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"CopyConstructor","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_a8 + local_68)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_68)) goto LAB_0013af7e;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013af7e:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_c8 + local_148)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_148)) goto LAB_0013b061;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013b061:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"int64_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_e8 + local_128)) {
    uVar5 = 0xf;
    if (local_f0 != local_e0) {
      uVar5 = local_e0[0];
    }
    if (uVar5 < (ulong)(local_e8 + local_128)) goto LAB_0013b12e;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013b12e:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013b1f8;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013b1f8:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90.field_2._8_8_ = puVar4[3];
    local_90._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_90._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_CopyConstructor<long>,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"CopyConstructor","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_a8 + local_68)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_68)) goto LAB_0013b3e4;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013b3e4:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_c8 + local_148)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_148)) goto LAB_0013b4c7;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013b4c7:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"float","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_e8 + local_128)) {
    uVar5 = 0xf;
    if (local_f0 != local_e0) {
      uVar5 = local_e0[0];
    }
    if (uVar5 < (ulong)(local_e8 + local_128)) goto LAB_0013b594;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013b594:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013b65e;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013b65e:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90.field_2._8_8_ = puVar4[3];
    local_90._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_90._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_CopyConstructor<float>,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"CopyConstructor","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_a8 + local_68)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_68)) goto LAB_0013b84a;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013b84a:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_c8 + local_148)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_148)) goto LAB_0013b92d;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013b92d:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"double","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_e8 + local_128)) {
    uVar5 = 0xf;
    if (local_f0 != local_e0) {
      uVar5 = local_e0[0];
    }
    if (uVar5 < (ulong)(local_e8 + local_128)) goto LAB_0013b9fa;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013b9fa:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013bac4;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013bac4:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90.field_2._8_8_ = puVar4[3];
    local_90._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_90._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_CopyConstructor<double>,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"AssignmentOperator","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_a8 + local_68)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_68)) goto LAB_0013bcb0;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013bcb0:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_c8 + local_148)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_148)) goto LAB_0013bd93;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013bd93:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"uint8_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_e8 + local_128)) {
    uVar5 = 0xf;
    if (local_f0 != local_e0) {
      uVar5 = local_e0[0];
    }
    if (uVar5 < (ulong)(local_e8 + local_128)) goto LAB_0013be60;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013be60:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013bf2a;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013bf2a:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90.field_2._8_8_ = puVar4[3];
    local_90._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_90._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<unsigned_char>,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"AssignmentOperator","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_a8 + local_68)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_68)) goto LAB_0013c116;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013c116:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_c8 + local_148)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_148)) goto LAB_0013c1f9;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013c1f9:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"uint16_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_e8 + local_128)) {
    uVar5 = 0xf;
    if (local_f0 != local_e0) {
      uVar5 = local_e0[0];
    }
    if (uVar5 < (ulong)(local_e8 + local_128)) goto LAB_0013c2c6;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013c2c6:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013c390;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013c390:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90.field_2._8_8_ = puVar4[3];
    local_90._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_90._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<unsigned_short>,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"AssignmentOperator","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_a8 + local_68)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_68)) goto LAB_0013c57c;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013c57c:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_c8 + local_148)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_148)) goto LAB_0013c65f;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013c65f:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"uint32_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_e8 + local_128)) {
    uVar5 = 0xf;
    if (local_f0 != local_e0) {
      uVar5 = local_e0[0];
    }
    if (uVar5 < (ulong)(local_e8 + local_128)) goto LAB_0013c72c;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013c72c:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013c7f6;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013c7f6:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90.field_2._8_8_ = puVar4[3];
    local_90._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_90._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<unsigned_int>,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"AssignmentOperator","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_a8 + local_68)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_68)) goto LAB_0013c9e2;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013c9e2:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_c8 + local_148)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_148)) goto LAB_0013cac5;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013cac5:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"uint64_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_e8 + local_128)) {
    uVar5 = 0xf;
    if (local_f0 != local_e0) {
      uVar5 = local_e0[0];
    }
    if (uVar5 < (ulong)(local_e8 + local_128)) goto LAB_0013cb92;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013cb92:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013cc5c;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013cc5c:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90.field_2._8_8_ = puVar4[3];
    local_90._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_90._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<unsigned_long>,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"AssignmentOperator","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_a8 + local_68)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_68)) goto LAB_0013ce48;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013ce48:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_c8 + local_148)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_148)) goto LAB_0013cf2b;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013cf2b:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"int8_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_e8 + local_128)) {
    uVar5 = 0xf;
    if (local_f0 != local_e0) {
      uVar5 = local_e0[0];
    }
    if (uVar5 < (ulong)(local_e8 + local_128)) goto LAB_0013cff8;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013cff8:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013d0c2;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013d0c2:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90.field_2._8_8_ = puVar4[3];
    local_90._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_90._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<signed_char>,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"AssignmentOperator","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_a8 + local_68)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_68)) goto LAB_0013d2ae;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013d2ae:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_c8 + local_148)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_148)) goto LAB_0013d391;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013d391:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"int16_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_e8 + local_128)) {
    uVar5 = 0xf;
    if (local_f0 != local_e0) {
      uVar5 = local_e0[0];
    }
    if (uVar5 < (ulong)(local_e8 + local_128)) goto LAB_0013d45e;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013d45e:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013d528;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013d528:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90.field_2._8_8_ = puVar4[3];
    local_90._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_90._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<short>,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"AssignmentOperator","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_a8 + local_68)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_68)) goto LAB_0013d714;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013d714:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_c8 + local_148)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_148)) goto LAB_0013d7f7;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013d7f7:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"int32_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_e8 + local_128)) {
    uVar5 = 0xf;
    if (local_f0 != local_e0) {
      uVar5 = local_e0[0];
    }
    if (uVar5 < (ulong)(local_e8 + local_128)) goto LAB_0013d8c4;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013d8c4:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013d98e;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013d98e:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90.field_2._8_8_ = puVar4[3];
    local_90._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_90._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<int>,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"AssignmentOperator","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_a8 + local_68)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_68)) goto LAB_0013db7a;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013db7a:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_c8 + local_148)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_148)) goto LAB_0013dc5d;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013dc5d:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"int64_t","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_e8 + local_128)) {
    uVar5 = 0xf;
    if (local_f0 != local_e0) {
      uVar5 = local_e0[0];
    }
    if (uVar5 < (ulong)(local_e8 + local_128)) goto LAB_0013dd2a;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013dd2a:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013ddf4;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013ddf4:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90.field_2._8_8_ = puVar4[3];
    local_90._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_90._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<long>,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"AssignmentOperator","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_a8 + local_68)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_68)) goto LAB_0013dfe0;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013dfe0:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_c8 + local_148)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_148)) goto LAB_0013e0c3;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013e0c3:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"float","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_e8 + local_128)) {
    uVar5 = 0xf;
    if (local_f0 != local_e0) {
      uVar5 = local_e0[0];
    }
    if (uVar5 < (ulong)(local_e8 + local_128)) goto LAB_0013e190;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013e190:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if (uVar5 < (ulong)(local_48 + local_108)) goto LAB_0013e25a;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_0013e25a:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
  }
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90.field_2._8_8_ = puVar4[3];
    local_90._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_90._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<float>,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"template_image::","");
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"AssignmentOperator","");
  uVar5 = 0xf;
  if (local_70 != local_60) {
    uVar5 = local_60[0];
  }
  if (uVar5 < (ulong)(local_a8 + local_68)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_68)) goto LAB_0013e446;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0013e446:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_b0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
    local_150 = (ulong *)*puVar4;
  }
  local_148 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," (","");
  uVar5 = 0xf;
  if (local_150 != &local_140) {
    uVar5 = local_140;
  }
  if (uVar5 < (ulong)(local_c8 + local_148)) {
    uVar5 = 0xf;
    if (local_d0 != local_c0) {
      uVar5 = local_c0[0];
    }
    if (uVar5 < (ulong)(local_c8 + local_148)) goto LAB_0013e529;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0013e529:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_d0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar4[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar4;
  }
  local_128 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"double","");
  uVar5 = 0xf;
  if (local_130 != &local_120) {
    uVar5 = local_120;
  }
  if (uVar5 < (ulong)(local_e8 + local_128)) {
    uVar5 = 0xf;
    if (local_f0 != local_e0) {
      uVar5 = local_e0[0];
    }
    if (uVar5 < (ulong)(local_e8 + local_128)) goto LAB_0013e5f6;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0013e5f6:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0);
  }
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,")","");
  uVar5 = 0xf;
  if (local_110 != &local_100) {
    uVar5 = local_100;
  }
  if (uVar5 < (ulong)(local_48 + local_108)) {
    uVar5 = 0xf;
    if (local_50 != local_40) {
      uVar5 = local_40[0];
    }
    if ((ulong)(local_48 + local_108) <= uVar5) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_110);
      goto LAB_0013e6e5;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50);
LAB_0013e6e5:
  psVar2 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90.field_2._8_8_ = puVar4[3];
    local_90._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar2;
    local_90._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_90._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<double>,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void addTests_Image_Buffer( UnitTestFramework & framework )
{
    ADD_TEST( framework, template_image::EmptyConstructor );
    ADD_TEST( framework, template_image::Constructor );
    ADD_TEST( framework, template_image::NullAssignment );

    ADD_TEMPLATE_FUNCTION( CopyConstructor, uint8_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, uint16_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, uint32_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, uint64_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, int8_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, int16_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, int32_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, int64_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, float );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, double );

    ADD_TEMPLATE_FUNCTION( AssignmentOperator, uint8_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, uint16_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, uint32_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, uint64_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, int8_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, int16_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, int32_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, int64_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, float );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, double );
}